

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_model *
rf_load_meshes_and_materials_for_model
          (rf_model *__return_storage_ptr__,rf_model model,rf_allocator allocator,
          rf_allocator temp_allocator)

{
  rf_source_location rVar1;
  rf_source_location rVar2;
  rf_source_location rVar3;
  rf_allocator_args rVar4;
  rf_allocator_args rVar5;
  rf_allocator allocator_00;
  rf_allocator allocator_01;
  undefined1 auVar6 [24];
  int iVar7;
  float fVar8;
  rf_int rVar9;
  rf_mesh *prVar10;
  rf_material *prVar11;
  void *pvVar12;
  rf_model *prVar13;
  rf_model *prVar14;
  rf_allocator_proc *prVar15;
  long lVar16;
  size_t __n;
  bool bVar17;
  byte bVar18;
  rf_allocator temp_allocator_00;
  rf_allocator allocator_local;
  uint uStack_174;
  uint uStack_144;
  uint uStack_114;
  rf_material local_c8;
  
  rVar9 = model.mesh_count;
  allocator_local.allocator_proc = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  prVar15 = temp_allocator.allocator_proc;
  pvVar12 = temp_allocator.user_data;
  bVar18 = 0;
  model.transform.m9 = 0.0;
  model.transform.m13 = 0.0;
  model.transform.m2 = 0.0;
  model.transform.m6 = 0.0;
  model.transform.m0 = 1.0;
  model.transform.m4 = 0.0;
  model.transform.m8 = 0.0;
  model.transform.m12 = 0.0;
  model.transform.m1 = 0.0;
  model.transform.m5 = 1.0;
  model.transform.m10 = 1.0;
  model.transform.m14 = 0.0;
  model.transform.m3 = 0.0;
  model.transform.m7 = 0.0;
  model.transform.m11 = 0.0;
  model.transform.m15 = 1.0;
  if (model.mesh_count == 0) {
    rf_log_impl(4,0x175881);
    model.mesh_count = 1;
    rVar1.proc_name._0_4_ = 0x17585a;
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.proc_name._4_4_ = 0;
    rVar1.line_in_file = 0x8163;
    rVar4._16_8_ = (ulong)uStack_114 << 0x20;
    rVar4.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x70) << 0x40,0);
    rVar4.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x70) << 0x40,8);
    prVar10 = (rf_mesh *)(*allocator_local.allocator_proc)(&allocator_local,rVar1,RF_AM_ALLOC,rVar4)
    ;
    prVar10->vertex_count = 0;
    prVar10->triangle_count = 0;
    prVar10->vertices = (float *)0x0;
    prVar10->texcoords = (float *)0x0;
    prVar10->texcoords2 = (float *)0x0;
    prVar10->normals = (float *)0x0;
    prVar10->tangents = (float *)0x0;
    prVar10->colors = (uchar *)0x0;
    prVar10->indices = (unsigned_short *)0x0;
    prVar10->anim_vertices = (float *)0x0;
    prVar10->anim_normals = (float *)0x0;
    prVar10->bone_ids = (int *)0x0;
    prVar10->bone_weights = (float *)0x0;
    *(undefined8 *)&prVar10->vao_id = 0;
    prVar10->vbo_id = (uint *)0x0;
    allocator_00.allocator_proc = allocator_local.allocator_proc;
    allocator_00.user_data = allocator_local.user_data;
    temp_allocator_00.allocator_proc = prVar15;
    temp_allocator_00.user_data = pvVar12;
    model.meshes = prVar10;
    rf_gen_mesh_cube((rf_mesh *)&local_c8,1.0,1.0,1.0,allocator_00,temp_allocator_00);
    prVar11 = &local_c8;
    for (lVar16 = 0xe; lVar16 != 0; lVar16 = lVar16 + -1) {
      iVar7 = (prVar11->shader).locs[0];
      prVar10->vertex_count = (prVar11->shader).id;
      prVar10->triangle_count = iVar7;
      prVar11 = (rf_material *)((long)prVar11 + (ulong)bVar18 * -0x10 + 8);
      prVar10 = (rf_mesh *)((long)prVar10 + (ulong)bVar18 * -0x10 + 8);
    }
    __n = 4;
  }
  else {
    prVar10 = model.meshes;
    lVar16 = 0;
    if (0 < model.mesh_count) {
      lVar16 = model.mesh_count;
    }
    while (bVar17 = lVar16 != 0, lVar16 = lVar16 + -1, bVar17) {
      rf_gfx_load_mesh(prVar10,false);
      prVar10 = prVar10 + 1;
    }
    __n = rVar9 << 2;
  }
  if (model.material_count == 0) {
    rf_log_impl(4,0x1758b0);
    model.material_count = 1;
    rVar2.proc_name._0_4_ = 0x17585a;
    rVar2.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar2.proc_name._4_4_ = 0;
    rVar2.line_in_file = 0x8173;
    rVar5._16_8_ = (ulong)uStack_144 << 0x20;
    rVar5.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x98) << 0x40,0);
    rVar5.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x98) << 0x40,8);
    prVar11 = (rf_material *)
              (*allocator_local.allocator_proc)(&allocator_local,rVar2,RF_AM_ALLOC,rVar5);
    model.materials = prVar11;
    memset(prVar11,0,0x98);
    allocator_01.allocator_proc = allocator_local.allocator_proc;
    allocator_01.user_data = allocator_local.user_data;
    rf_load_default_material(&local_c8,allocator_01);
    memcpy(prVar11,&local_c8,0x98);
    if (model.mesh_material == (int *)0x0) {
      rVar3.proc_name._0_4_ = 0x17585a;
      rVar3.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar3.proc_name._4_4_ = 0;
      rVar3.line_in_file = 0x8179;
      auVar6._8_8_ = (ulong)uStack_174 << 0x20;
      auVar6._0_8_ = __n;
      auVar6._16_8_ = 0;
      model.mesh_material =
           (int *)(*allocator_local.allocator_proc)
                            (&allocator_local,rVar3,RF_AM_ALLOC,(rf_allocator_args)(auVar6 << 0x40))
      ;
      memset(model.mesh_material,0,__n);
    }
  }
  prVar13 = &model;
  prVar14 = __return_storage_ptr__;
  for (lVar16 = 0x10; lVar16 != 0; lVar16 = lVar16 + -1) {
    fVar8 = (prVar13->transform).m4;
    (prVar14->transform).m0 = (prVar13->transform).m0;
    (prVar14->transform).m4 = fVar8;
    prVar13 = (rf_model *)((long)prVar13 + (ulong)bVar18 * -0x10 + 8);
    prVar14 = (rf_model *)((long)prVar14 + (ulong)bVar18 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_INTERNAL rf_model rf_load_meshes_and_materials_for_model(rf_model model, rf_allocator allocator, rf_allocator temp_allocator)
{
    // Make sure model transform is set to identity matrix!
    model.transform = rf_mat_identity();

    if (model.mesh_count == 0)
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "No meshes can be loaded, default to cube mesh.");

        model.mesh_count = 1;
        model.meshes = (rf_mesh *) RF_ALLOC(allocator, sizeof(rf_mesh));
        memset(model.meshes, 0, sizeof(rf_mesh));
        model.meshes[0] = rf_gen_mesh_cube(1.0f, 1.0f, 1.0f, allocator, temp_allocator);
    }
    else
    {
        // Upload vertex data to GPU (static mesh)
        for (rf_int i = 0; i < model.mesh_count; i++)
            rf_gfx_load_mesh(&model.meshes[i], false);
    }

    if (model.material_count == 0)
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "No materials can be loaded, default to white material.");

        model.material_count = 1;
        model.materials = (rf_material *) RF_ALLOC(allocator, sizeof(rf_material));
        memset(model.materials, 0, sizeof(rf_material));
        model.materials[0] = rf_load_default_material(allocator);

        if (model.mesh_material == NULL)
        {
            model.mesh_material = (int *) RF_ALLOC(allocator, model.mesh_count * sizeof(int));
            memset(model.mesh_material, 0, model.mesh_count * sizeof(int));
        }
    }

    return model;
}